

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_window_is_any_hovered(nk_context *ctx)

{
  float fVar1;
  nk_rect rect;
  int iVar2;
  nk_input *in_RDI;
  nk_rect header;
  nk_window *iter;
  undefined8 uStack_20;
  long local_18;
  
  if (in_RDI != (nk_input *)0x0) {
    for (local_18 = *(long *)&in_RDI[0x31].keyboard.keys[4].clicked; local_18 != 0;
        local_18 = *(long *)(local_18 + 0x188)) {
      if ((*(uint *)(local_18 + 0x48) & 0x4000) == 0) {
        iVar2 = nk_input_is_mouse_hovering_rect(in_RDI,*(nk_rect *)(local_18 + 0x4c));
        if (iVar2 != 0) {
          return 1;
        }
      }
      else {
        fVar1 = (float)in_RDI[0x17].keyboard.keys[0].clicked;
        uStack_20._0_4_ = (undefined4)*(undefined8 *)(local_18 + 0x54);
        rect.w = (float)(undefined4)uStack_20;
        rect.h = fVar1 + fVar1 + *(float *)(*(long *)&in_RDI[1].keyboard.keys[0].clicked + 8);
        rect._0_8_ = *(undefined8 *)(local_18 + 0x4c);
        iVar2 = nk_input_is_mouse_hovering_rect(in_RDI,rect);
        if (iVar2 != 0) {
          return 1;
        }
      }
      if (((*(int *)(local_18 + 0x120) != 0) && (*(long *)(local_18 + 0x110) != 0)) &&
         (iVar2 = nk_input_is_mouse_hovering_rect
                            (in_RDI,*(nk_rect *)(*(long *)(local_18 + 0x110) + 0x4c)), iVar2 != 0))
      {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

NK_API int
nk_window_is_any_hovered(struct nk_context *ctx)
{
    struct nk_window *iter;
    NK_ASSERT(ctx);
    if (!ctx) return 0;
    iter = ctx->begin;
    while (iter) {
        /* check if window is being hovered */
        if (iter->flags & NK_WINDOW_MINIMIZED) {
            struct nk_rect header = iter->bounds;
            header.h = ctx->style.font->height + 2 * ctx->style.window.header.padding.y;
            if (nk_input_is_mouse_hovering_rect(&ctx->input, header))
                return 1;
        } else if (nk_input_is_mouse_hovering_rect(&ctx->input, iter->bounds)) {
            return 1;
        }
        /* check if window popup is being hovered */
        if (iter->popup.active && iter->popup.win && nk_input_is_mouse_hovering_rect(&ctx->input, iter->popup.win->bounds))
            return 1;
        iter = iter->next;
    }
    return 0;
}